

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O0

void slave(void)

{
  FILE *pFVar1;
  size_t offset_00;
  int iVar2;
  char *pcVar3;
  undefined1 local_288 [8];
  BigBlockPtr ptrnew;
  BigArray array;
  int64_t chunksize;
  int64_t offset;
  MPI_Status status;
  int64_t work [2];
  undefined4 local_c [2];
  int result;
  
  local_c[0] = 0;
  MPI_Send(local_c,1,&ompi_mpi_int,0,0x50d,&ompi_mpi_comm_world);
  do {
    while( true ) {
      MPI_Recv(&status._ucount,1,MPI_TYPE_WORK,0,0xffffffff,&ompi_mpi_comm_world,&offset);
      offset_00 = status._ucount;
      if (offset._4_4_ == 0x50a) {
        return;
      }
      iVar2 = big_block_read_simple
                        (&bb,status._ucount,work[0],(BigArray *)&ptrnew.aoffset,(char *)0x0);
      pFVar1 = _stderr;
      if (iVar2 == 0) break;
      pcVar3 = big_file_get_error_message();
      fprintf(pFVar1,"failed to read original: %s\n",pcVar3);
      local_c[0] = 0xffffffff;
LAB_00103d58:
      MPI_Send(local_c,1,&ompi_mpi_int,0,0x50f,&ompi_mpi_comm_world);
    }
    iVar2 = big_block_seek(&bbnew,(BigBlockPtr *)local_288,offset_00);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar3 = big_file_get_error_message();
      fprintf(pFVar1,"failed to seek new: %s\n",pcVar3);
      local_c[0] = 0xffffffff;
      free((void *)array.size);
      goto LAB_00103d58;
    }
    iVar2 = big_block_write(&bbnew,(BigBlockPtr *)local_288,(BigArray *)&ptrnew.aoffset);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      pcVar3 = big_file_get_error_message();
      fprintf(pFVar1,"failed to write new: %s\n",pcVar3);
      local_c[0] = 0xffffffff;
      free((void *)array.size);
      goto LAB_00103d58;
    }
    free((void *)array.size);
    MPI_Send(local_c,1,&ompi_mpi_int,0,0x50d,&ompi_mpi_comm_world);
  } while( true );
}

Assistant:

void slave() {
    int result = 0;
    MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
    while(1) {
        int64_t work[2];
        MPI_Status status;
        MPI_Recv(work, 1, MPI_TYPE_WORK, 0, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

        if(status.MPI_TAG == DIE_TAG) {
            break;
        }
        int64_t offset = work[0];
        int64_t chunksize = work[1];
        BigArray array;
        BigBlockPtr ptrnew;

        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            result = -1;
            goto bad;
        }
        if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
            fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
            fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        free(array.data);
        MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
        continue;
    bad:
        MPI_Send(&result, 1, MPI_INT, 0, ERROR_TAG, MPI_COMM_WORLD);
        continue;
    }
    return;
}